

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

int __thiscall ImFontAtlas::AddCustomRectRegular(ImFontAtlas *this,uint id,int width,int height)

{
  CustomRect *pCVar1;
  int iVar2;
  CustomRect *__dest;
  int iVar3;
  int iVar4;
  
  iVar2 = (this->CustomRects).Size;
  if (iVar2 == (this->CustomRects).Capacity) {
    if (iVar2 == 0) {
      iVar3 = 8;
    }
    else {
      iVar3 = iVar2 / 2 + iVar2;
    }
    iVar4 = iVar2 + 1;
    if (iVar2 + 1 < iVar3) {
      iVar4 = iVar3;
    }
    __dest = (CustomRect *)ImGui::MemAlloc((long)iVar4 << 5);
    pCVar1 = (this->CustomRects).Data;
    if (pCVar1 != (CustomRect *)0x0) {
      memcpy(__dest,pCVar1,(long)(this->CustomRects).Size << 5);
      ImGui::MemFree((this->CustomRects).Data);
    }
    (this->CustomRects).Data = __dest;
    (this->CustomRects).Capacity = iVar4;
    iVar2 = (this->CustomRects).Size;
  }
  else {
    __dest = (this->CustomRects).Data;
  }
  __dest[iVar2].ID = id;
  __dest[iVar2].Width = (unsigned_short)width;
  __dest[iVar2].Height = (unsigned_short)height;
  __dest[iVar2].X = 0xffff;
  __dest[iVar2].Y = 0xffff;
  pCVar1 = __dest + iVar2;
  pCVar1->GlyphAdvanceX = 0.0;
  (pCVar1->GlyphOffset).x = 0.0;
  *(undefined8 *)(&pCVar1->GlyphAdvanceX + 2) = 0;
  *(undefined4 *)((long)&__dest[iVar2].Font + 4) = 0;
  iVar2 = (this->CustomRects).Size;
  (this->CustomRects).Size = iVar2 + 1;
  return iVar2;
}

Assistant:

int ImFontAtlas::AddCustomRectRegular(unsigned int id, int width, int height)
{
    IM_ASSERT(id >= 0x10000);
    IM_ASSERT(width > 0 && width <= 0xFFFF);
    IM_ASSERT(height > 0 && height <= 0xFFFF);
    CustomRect r;
    r.ID = id;
    r.Width = (unsigned short)width;
    r.Height = (unsigned short)height;
    CustomRects.push_back(r);
    return CustomRects.Size - 1; // Return index
}